

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

SchemaElementDecl * __thiscall
xercesc_4_0::TraverseSchema::traverseElementDecl
          (TraverseSchema *this,DOMElement *elem,bool topLevel)

{
  SchemaGrammar *pSVar1;
  SchemaInfo *this_00;
  Janitor<xercesc_4_0::XSAnnotation> elem_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ModelTypes toSet;
  XMLCh *pXVar6;
  XMLSize_t count;
  undefined4 extraout_var;
  DOMElement *pDVar7;
  XSAnnotation *pXVar8;
  XSAnnotation *pXVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar10;
  DatatypeValidator *pDVar11;
  ComplexTypeInfo *pCVar12;
  SchemaAttDef *this_01;
  uint local_124;
  int miscFlags;
  DOMElement *ic;
  XMLCh *subsGroupName;
  ComplexTypeInfo *eltTypeInfo;
  DatatypeValidator *eltDV;
  XMLCh *anotherSchemaURI;
  XMLCh *pXStack_f0;
  bool noErrorFound;
  XMLCh *typeURI;
  XMLCh *typePrefix;
  XMLCh *typeLocalPart;
  XMLCh *typeStr;
  XMLCh *temp_1;
  XMLCh *typeInfoName;
  XMLCh *temp;
  XMLCh *contentName;
  DatatypeValidator *validator;
  ComplexTypeInfo *typeInfo;
  XSAnnotation *pXStack_98;
  bool anonymousType;
  XSAnnotation *xsAnnot;
  SchemaElementDecl *elemDecl;
  XMLCh *valueConstraint;
  bool isDuplicate;
  Janitor<xercesc_4_0::XSAnnotation> janAnnot;
  DOMElement *content;
  unsigned_short scope;
  SchemaElementDecl *retDecl;
  XMLCh *name;
  XMLCh *refName;
  NamespaceScopeManager nsMgr;
  bool topLevel_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo._7_1_ = topLevel;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)&refName,elem,this->fSchemaInfo,this);
  if (((nsMgr.fSchemaInfo._7_1_ & 1) == 0) &&
     (pXVar6 = getElementAttValue(this,elem,L"ref",QName), pXVar6 != (XMLCh *)0x0)) {
    this_local = (TraverseSchema *)processElementDeclRef(this,elem,pXVar6);
  }
  else {
    pXVar6 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
    if ((pXVar6 == (XMLCh *)0x0) || (*pXVar6 == L'\0')) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x11);
      this_local = (TraverseSchema *)0x0;
    }
    else {
      count = XMLString::stringLen(pXVar6);
      bVar2 = XMLChar1_0::isValidNCName(pXVar6,count);
      if (bVar2) {
        if ((nsMgr.fSchemaInfo._7_1_ & 1) != 0) {
          iVar3 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable
                    [0xb])(this->fSchemaGrammar,(ulong)(uint)this->fTargetNSURI,pXVar6,0,0xfffffffe)
          ;
          this_local = (TraverseSchema *)CONCAT44(extraout_var,iVar3);
          if (this_local != (TraverseSchema *)0x0) goto LAB_004295a5;
        }
        GeneralAttributeCheck::checkAttributes
                  (&this->fAttributeCheck,elem,0x10 - (nsMgr.fSchemaInfo._7_1_ & 1),this,
                   (bool)(nsMgr.fSchemaInfo._7_1_ & 1),this->fNonXSAttList);
        pDVar7 = XUtil::getFirstChildElement(&elem->super_DOMNode);
        janAnnot.fData = (XSAnnotation *)checkContent(this,elem,pDVar7,true,true);
        if ((this->fAnnotation == (XSAnnotation *)0x0) &&
           (bVar2 = XMLScanner::getGenerateSyntheticAnnotations(this->fScanner), bVar2)) {
          pXVar9 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
          this->fAnnotation = pXVar9;
        }
        Janitor<xercesc_4_0::XSAnnotation>::Janitor
                  ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff88,this->fAnnotation)
        ;
        valueConstraint._7_1_ = 0;
        elemDecl = (SchemaElementDecl *)0x0;
        xsAnnot = (XSAnnotation *)
                  createSchemaElementDecl
                            (this,elem,pXVar6,(bool *)((long)&valueConstraint + 7),
                             (XMLCh **)&elemDecl,(bool)(nsMgr.fSchemaInfo._7_1_ & 1));
        if ((valueConstraint._7_1_ & 1) == 0) {
          (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0x11])
                    (this->fSchemaGrammar,xsAnnot,0);
          if (elemDecl != (SchemaElementDecl *)0x0) {
            SchemaElementDecl::setDefaultValue((SchemaElementDecl *)xsAnnot,(XMLCh *)elemDecl);
          }
          bVar2 = Janitor<xercesc_4_0::XSAnnotation>::isDataNull
                            ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff88);
          pXVar9 = xsAnnot;
          if (!bVar2) {
            pSVar1 = this->fSchemaGrammar;
            pXVar8 = Janitor<xercesc_4_0::XSAnnotation>::release
                               ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff88);
            SchemaGrammar::putAnnotation(pSVar1,pXVar9,pXVar8);
          }
          if (this->fCurrentComplexType != (ComplexTypeInfo *)0x0) {
            uVar4 = SchemaElementDecl::getEnclosingScope((SchemaElementDecl *)xsAnnot);
            uVar5 = ComplexTypeInfo::getScopeDefined(this->fCurrentComplexType);
            if (uVar4 == uVar5) {
              ComplexTypeInfo::addElement(this->fCurrentComplexType,(SchemaElementDecl *)xsAnnot);
              SchemaElementDecl::setPSVIScope((SchemaElementDecl *)xsAnnot,SCP_LOCAL);
            }
          }
          if (this->fCurrentGroupInfo != (XercesGroupInfo *)0x0) {
            uVar4 = SchemaElementDecl::getEnclosingScope((SchemaElementDecl *)xsAnnot);
            uVar5 = XercesGroupInfo::getScope(this->fCurrentGroupInfo);
            if (uVar4 == uVar5) {
              XercesGroupInfo::addElement(this->fCurrentGroupInfo,(SchemaElementDecl *)xsAnnot);
              SchemaElementDecl::setPSVIScope((SchemaElementDecl *)xsAnnot,SCP_ABSENT);
            }
          }
        }
        else if (this->fAnnotation != (XSAnnotation *)0x0) {
          pXVar8 = SchemaGrammar::getAnnotation(this->fSchemaGrammar,xsAnnot);
          pXVar9 = xsAnnot;
          pXStack_98 = pXVar8;
          if (pXVar8 == (XSAnnotation *)0x0) {
            pSVar1 = this->fSchemaGrammar;
            pXVar8 = Janitor<xercesc_4_0::XSAnnotation>::release
                               ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff88);
            SchemaGrammar::putAnnotation(pSVar1,pXVar9,pXVar8);
          }
          else {
            pXVar9 = Janitor<xercesc_4_0::XSAnnotation>::release
                               ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff88);
            XSAnnotation::setNext(pXVar8,pXVar9);
          }
        }
        typeInfo._7_1_ = 0;
        validator = (DatatypeValidator *)0x0;
        contentName = (XMLCh *)0x0;
        if (janAnnot.fData != (XSAnnotation *)0x0) {
          iVar3 = (*((janAnnot.fData)->super_XSerializable)._vptr_XSerializable[0x18])();
          temp = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
          bVar2 = XMLString::equals(temp,(XMLCh *)SchemaSymbols::fgELT_COMPLEXTYPE);
          if (bVar2) {
            iVar3 = (*((janAnnot.fData)->super_XSerializable)._vptr_XSerializable[0x29])
                              (janAnnot.fData,SchemaSymbols::fgATT_NAME);
            typeInfoName = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
            if ((typeInfoName == (XMLCh *)0x0) || (*typeInfoName == L'\0')) {
              validator = (DatatypeValidator *)
                          checkForComplexTypeInfo(this,(DOMElement *)janAnnot.fData);
              if (((ComplexTypeInfo *)validator != (ComplexTypeInfo *)0x0) &&
                 ((contentName = (XMLCh *)ComplexTypeInfo::getDatatypeValidator
                                                    ((ComplexTypeInfo *)validator),
                  (valueConstraint._7_1_ & 1) == 0 &&
                  (bVar2 = ComplexTypeInfo::getPreprocessed((ComplexTypeInfo *)validator), bVar2))))
              {
                pXVar10 = ComplexTypeInfo::getTypeName((ComplexTypeInfo *)validator);
                elem_00 = janAnnot;
                this_00 = this->fSchemaInfo;
                temp_1 = pXVar10;
                iVar3 = XMLString::indexOf(pXVar10,L',');
                SchemaInfo::addRecursingType
                          (this_00,(DOMElement *)elem_00.fData,pXVar10 + (long)iVar3 + 1);
              }
            }
            else {
              reportSchemaError(this,(DOMElement *)janAnnot.fData,(XMLCh *)XMLUni::fgXMLErrDomain,
                                0x14,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            }
            typeInfo._7_1_ = 1;
            janAnnot.fData = (XSAnnotation *)XUtil::getNextSiblingElement(janAnnot.fData);
          }
          else {
            bVar2 = XMLString::equals(temp,(XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE);
            if (bVar2) {
              iVar3 = (*((janAnnot.fData)->super_XSerializable)._vptr_XSerializable[0x29])
                                (janAnnot.fData,SchemaSymbols::fgATT_NAME);
              typeStr = (XMLCh *)CONCAT44(extraout_var_02,iVar3);
              if ((typeStr == (XMLCh *)0x0) || (*typeStr == L'\0')) {
                contentName = (XMLCh *)checkForSimpleTypeValidator
                                                 (this,(DOMElement *)janAnnot.fData,0);
              }
              else {
                reportSchemaError(this,(DOMElement *)janAnnot.fData,(XMLCh *)XMLUni::fgXMLErrDomain,
                                  0x15,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
              }
              typeInfo._7_1_ = 1;
              janAnnot.fData = (XSAnnotation *)XUtil::getNextSiblingElement(janAnnot.fData);
            }
          }
          if ((janAnnot.fData != (XSAnnotation *)0x0) &&
             (janAnnot.fData = (XSAnnotation *)checkIdentityConstraintContent(this,janAnnot.fData),
             janAnnot.fData != (XSAnnotation *)0x0)) {
            reportSchemaError(this,(DOMElement *)janAnnot.fData,(XMLCh *)XMLUni::fgXMLErrDomain,0x16
                             );
          }
        }
        typeLocalPart = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_TYPE,QName);
        if (typeLocalPart != (XMLCh *)0x0) {
          if ((typeInfo._7_1_ & 1) == 0) {
            if (*typeLocalPart != L'\0') {
              typePrefix = getLocalPart(this,typeLocalPart);
              typeURI = getPrefix(this,typeLocalPart);
              pXStack_f0 = resolvePrefixToURI(this,elem,typeURI);
              bVar2 = XMLString::equals(pXStack_f0,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
              if ((!bVar2) ||
                 (bVar2 = XMLString::equals(typePrefix,(XMLCh *)SchemaSymbols::fgATTVAL_ANYTYPE),
                 !bVar2)) {
                checkEnumerationRequiredNotation(this,elem,pXVar6,typeLocalPart);
                anotherSchemaURI._7_1_ = 1;
                pXVar10 = checkTypeFromAnotherSchema(this,elem,typeLocalPart);
                validator = (DatatypeValidator *)
                            getElementComplexTypeInfo(this,elem,typeLocalPart,pXVar10);
                if ((ComplexTypeInfo *)validator == (ComplexTypeInfo *)0x0) {
                  contentName = (XMLCh *)getElementTypeValidator
                                                   (this,elem,typeLocalPart,
                                                    (bool *)((long)&anotherSchemaURI + 7),pXVar10);
                }
                else {
                  contentName = (XMLCh *)ComplexTypeInfo::getDatatypeValidator
                                                   ((ComplexTypeInfo *)validator);
                }
              }
            }
          }
          else {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x36,pXVar6,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        if ((valueConstraint._7_1_ & 1) == 0) {
          SchemaElementDecl::setDatatypeValidator
                    ((SchemaElementDecl *)xsAnnot,(DatatypeValidator *)contentName);
          SchemaElementDecl::setComplexTypeInfo
                    ((SchemaElementDecl *)xsAnnot,(ComplexTypeInfo *)validator);
          pXVar9 = xsAnnot;
          if (contentName == (XMLCh *)0x0) {
            if (validator != (DatatypeValidator *)0x0) {
              toSet = ComplexTypeInfo::getContentType((ComplexTypeInfo *)validator);
              SchemaElementDecl::setModelType((SchemaElementDecl *)pXVar9,toSet);
            }
          }
          else {
            SchemaElementDecl::setModelType((SchemaElementDecl *)xsAnnot,Simple);
          }
          if ((((nsMgr.fSchemaInfo._7_1_ & 1) != 0) &&
              (pXVar6 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_SUBSTITUTIONGROUP
                                           ,QName), pXVar6 != (XMLCh *)0x0)) && (*pXVar6 != L'\0'))
          {
            processSubstitutionGroup
                      (this,elem,(SchemaElementDecl *)xsAnnot,(ComplexTypeInfo **)&validator,
                       (DatatypeValidator **)&contentName,pXVar6);
          }
          pDVar7 = XUtil::getFirstChildElementNS
                             (&elem->super_DOMNode,(XMLCh **)fgIdentityConstraints,
                              (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA,3);
          if (pDVar7 != (DOMElement *)0x0) {
            processElemDeclIC(this,pDVar7,(SchemaElementDecl *)xsAnnot);
          }
        }
        else {
          pDVar11 = SchemaElementDecl::getDatatypeValidator((SchemaElementDecl *)xsAnnot);
          pCVar12 = SchemaElementDecl::getComplexTypeInfo((SchemaElementDecl *)xsAnnot);
          if ((pCVar12 != (ComplexTypeInfo *)validator) ||
             (pDVar11 != (DatatypeValidator *)contentName)) {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x43,pXVar6,(XMLCh *)0x0,
                              (XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        if ((validator == (DatatypeValidator *)0x0) && (contentName == (XMLCh *)0x0)) {
          if ((valueConstraint._7_1_ & 1) == 0) {
            SchemaElementDecl::setModelType((SchemaElementDecl *)xsAnnot,Any);
            pXVar9 = xsAnnot;
            this_01 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
            SchemaAttDef::SchemaAttDef
                      (this_01,L"",L"",this->fEmptyNamespaceURI,Any_Any,ProcessContents_Lax,
                       this->fGrammarPoolMemoryManager);
            SchemaElementDecl::setAttWildCard((SchemaElementDecl *)pXVar9,this_01);
          }
        }
        else if ((elemDecl != (SchemaElementDecl *)0x0) &&
                ((bVar2 = checkElemDeclValueConstraint
                                    (this,elem,(SchemaElementDecl *)xsAnnot,(XMLCh *)elemDecl,
                                     (ComplexTypeInfo *)validator,(DatatypeValidator *)contentName),
                 !bVar2 && ((valueConstraint._7_1_ & 1) == 0)))) {
          local_124 = SchemaElementDecl::getMiscFlags((SchemaElementDecl *)xsAnnot);
          local_124 = local_124 & 0xfffffffb;
          SchemaElementDecl::setDefaultValue((SchemaElementDecl *)xsAnnot,(XMLCh *)0x0);
          SchemaElementDecl::setMiscFlags((SchemaElementDecl *)xsAnnot,local_124);
        }
        this_local = (TraverseSchema *)xsAnnot;
        Janitor<xercesc_4_0::XSAnnotation>::~Janitor
                  ((Janitor<xercesc_4_0::XSAnnotation> *)&stack0xffffffffffffff88);
      }
      else {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,
                          (XMLCh *)SchemaSymbols::fgELT_ELEMENT,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0);
        this_local = (TraverseSchema *)0x0;
      }
    }
  }
LAB_004295a5:
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)&refName);
  return (SchemaElementDecl *)this_local;
}

Assistant:

SchemaElementDecl*
TraverseSchema::traverseElementDecl(const DOMElement* const elem,
                                    const bool topLevel)
{
    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // if local element and ref attribute exists
    if (!topLevel)
    {
        const XMLCh* refName = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
        if (refName)
            return processElementDeclRef(elem, refName);
    }

    // check for empty name
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    if (!name || !*name)
    {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefElement);
        return 0;
    }

    // make sure that name is a valid NCName
    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name)))
    {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain,
            XMLErrs::InvalidDeclarationName, SchemaSymbols::fgELT_ELEMENT, name);
        return 0;
    }

    // if element already exists, just return --- revisit, it should not happen
    if (topLevel)
    {
        SchemaElementDecl* retDecl = (SchemaElementDecl*) fSchemaGrammar->getElemDecl(fTargetNSURI, name, 0, Grammar::TOP_LEVEL_SCOPE);
        if (retDecl)
            return retDecl;
    }

    // Check attributes
    unsigned short scope = (topLevel) ? GeneralAttributeCheck::E_ElementGlobal
                                      : GeneralAttributeCheck::E_ElementLocal;

    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    // check annotation
    const DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
    // Put annotations on all elements for the situation where there is a group of
    // elements and not all have annotations.
    //if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    if (!fAnnotation && fScanner->getGenerateSyntheticAnnotations())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // Create element decl
    bool isDuplicate = false;
    const XMLCh* valueConstraint = 0;
    SchemaElementDecl* elemDecl =
        createSchemaElementDecl(elem, name, isDuplicate, valueConstraint, topLevel);

    if (!isDuplicate) {

        fSchemaGrammar->putElemDecl(elemDecl);

        if (valueConstraint)
            elemDecl->setDefaultValue(valueConstraint);

        if (!janAnnot.isDataNull())
            fSchemaGrammar->putAnnotation(elemDecl, janAnnot.release());

        if (fCurrentComplexType &&
            elemDecl->getEnclosingScope() == fCurrentComplexType->getScopeDefined()) {
            fCurrentComplexType->addElement(elemDecl);
            elemDecl->setPSVIScope(PSVIDefs::SCP_LOCAL);
        }

        if (fCurrentGroupInfo &&
            elemDecl->getEnclosingScope() == fCurrentGroupInfo->getScope()) {
            fCurrentGroupInfo->addElement(elemDecl);
            elemDecl->setPSVIScope(PSVIDefs::SCP_ABSENT);
        }
    }
    else {
        if (fAnnotation) {
            XSAnnotation* xsAnnot = fSchemaGrammar->getAnnotation(elemDecl);
            if (!xsAnnot) {
                fSchemaGrammar->putAnnotation(elemDecl, janAnnot.release());
            }
            else {
                xsAnnot->setNext(janAnnot.release());
            }
        }
    }

    // Process children
    bool               anonymousType = false;
    ComplexTypeInfo*   typeInfo = 0;
    DatatypeValidator* validator = 0;

    if (content != 0)
    {
        const XMLCh* contentName = content->getLocalName();

        if (XMLString::equals(contentName, SchemaSymbols::fgELT_COMPLEXTYPE))
        {
            const XMLCh* temp = content->getAttribute(SchemaSymbols::fgATT_NAME);

            if (temp && *temp)
            {
                // REVISIT - we are bypassing the complex type declaration.
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AnonComplexTypeWithName, name);
            }
            else
            {
                typeInfo = checkForComplexTypeInfo(content);

                if (typeInfo)
                {
                    validator = typeInfo->getDatatypeValidator();

                    if (!isDuplicate) {

                        //Recursing element
                        if (typeInfo->getPreprocessed()) {

                            const XMLCh* typeInfoName = typeInfo->getTypeName();
                            fSchemaInfo->addRecursingType(content, typeInfoName + XMLString::indexOf(typeInfoName, chComma) + 1);
                        }
                    }
                }
            }

            anonymousType = true;
            content = XUtil::getNextSiblingElement(content);
        }
        else if (XMLString::equals(contentName, SchemaSymbols::fgELT_SIMPLETYPE))
        {
            const XMLCh* temp = content->getAttribute(SchemaSymbols::fgATT_NAME);
            if (temp && *temp)
                // REVISIT - we are bypassing the simple type declaration.
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AnonSimpleTypeWithName, name);
            else
                validator = checkForSimpleTypeValidator(content);

            anonymousType = true;
            content = XUtil::getNextSiblingElement(content);
        }

        // Check for identity constraints
        if (content != 0)
        {
            content = checkIdentityConstraintContent(content);
            if (content != 0)
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::InvalidElementContent);
        }
    }

    // Handle 'type' attribute
    const XMLCh* typeStr = getElementAttValue(elem, SchemaSymbols::fgATT_TYPE, DatatypeValidator::QName);
    if (typeStr)
    {
        if (anonymousType)
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::ElementWithTypeAndAnonType, name);
        }
        else if (*typeStr)
        {
            const XMLCh* typeLocalPart = getLocalPart(typeStr);
            const XMLCh* typePrefix = getPrefix(typeStr);
            const XMLCh* typeURI = resolvePrefixToURI(elem, typePrefix);

            if (!XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
                || !XMLString::equals(typeLocalPart, SchemaSymbols::fgATTVAL_ANYTYPE))
            {
                checkEnumerationRequiredNotation(elem, name, typeStr);

                bool noErrorFound = true;
                const XMLCh* anotherSchemaURI = checkTypeFromAnotherSchema(elem, typeStr);

                // get complex type info
                typeInfo = getElementComplexTypeInfo(elem, typeStr, anotherSchemaURI);

                // get simple type validtor - if not a complex type
                if (typeInfo)
                    validator = typeInfo->getDatatypeValidator();
                else
                    validator = getElementTypeValidator(elem, typeStr, noErrorFound, anotherSchemaURI);
            }
        }
    }

    // check for duplicate elements with different types.
    if (isDuplicate)
    {
        DatatypeValidator* eltDV = elemDecl->getDatatypeValidator();
        ComplexTypeInfo*   eltTypeInfo = elemDecl->getComplexTypeInfo();

        if ( (eltTypeInfo != typeInfo) || (eltDV != validator))  {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, name);
        }
    }
    // Set element declararion type information
    else
    {
        elemDecl->setDatatypeValidator(validator);
        elemDecl->setComplexTypeInfo(typeInfo);

        if (validator)
            elemDecl->setModelType(SchemaElementDecl::Simple);
        else if (typeInfo)
            elemDecl->setModelType((SchemaElementDecl::ModelTypes)typeInfo->getContentType());

        if (topLevel) {

            // Handle the substitutionGroup
            const XMLCh* subsGroupName = getElementAttValue(elem, SchemaSymbols::fgATT_SUBSTITUTIONGROUP, DatatypeValidator::QName);
            if (subsGroupName && *subsGroupName)
                 processSubstitutionGroup(elem, elemDecl, typeInfo, validator, subsGroupName);
        }

        // process identity constraints
        DOMElement* ic = XUtil::getFirstChildElementNS(
            elem, fgIdentityConstraints, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, 3);

        if (ic)
            processElemDeclIC(ic, elemDecl);
    }

    if (!typeInfo && !validator)
    {
        if (!isDuplicate)
        {
            elemDecl->setModelType(SchemaElementDecl::Any);
            elemDecl->setAttWildCard(
                new (fGrammarPoolMemoryManager) SchemaAttDef(
                    XMLUni::fgZeroLenString, XMLUni::fgZeroLenString,
                    fEmptyNamespaceURI, XMLAttDef::Any_Any,
                    XMLAttDef::ProcessContents_Lax, fGrammarPoolMemoryManager
                )
            );
        }
    }
    else if (valueConstraint)
    {
        if (!checkElemDeclValueConstraint(elem, elemDecl, valueConstraint, typeInfo, validator)
            && !isDuplicate)
        {
            int miscFlags = elemDecl->getMiscFlags();
            miscFlags &= ~ SchemaSymbols::XSD_FIXED;
            elemDecl->setDefaultValue(0);
            elemDecl->setMiscFlags(miscFlags);
        }
    }

    return elemDecl;
}